

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execLink<(moira::Core)2,(moira::Instr)68,(moira::Mode)12,2>(Moira *this,u16 opcode)

{
  u32 *puVar1;
  u32 uVar2;
  u32 uVar3;
  ulong uVar4;
  
  this->cp = 0;
  uVar2 = (this->reg).field_3.field_0.a[7];
  uVar3 = readI<(moira::Core)2,2>(this);
  (this->reg).ipl = this->ipl;
  uVar4 = (ulong)(opcode & 7);
  push<(moira::Core)2,4,0ull>
            (this,(*(int *)((long)&(this->reg).field_3 + uVar4 * 4 + 0x20) +
                  (uint)((~(uint)opcode & 7) != 0) * 4) - 4);
  *(u32 *)((long)&(this->reg).field_3 + uVar4 * 4 + 0x20) = uVar2 - 4;
  puVar1 = (this->reg).field_3.field_0.a + 7;
  *puVar1 = *puVar1 + (int)(short)uVar3;
  prefetch<(moira::Core)2,0ull>(this);
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 5));
  return;
}

Assistant:

void
Moira::execLink(u16 opcode)
{
    AVAILABILITY(S == Long ? Core::C68020 : Core::C68000)

    u16 ird  = getIRD();
    u32 sp   = getSP() - 4;

    int ax   = _____________xxx(opcode);
    i32 disp = SEXT <S> (readI<C, S>());

    // Check for address error
    if (misaligned<C>(sp)) {

        writeBuffer = u16(readA(ax) >> 16);
        writeA(ax, sp);
        throw AddressError(makeFrame<AE_DATA|AE_WRITE>(sp, getPC() + 2, getSR(), ird));
    }

    POLL_IPL;

    // Write to stack
    push <C, Long>(readA(ax) - ((MOIRA_MIMIC_MUSASHI && ax == 7) ? 4 : 0));

    // Modify address register and stack pointer
    writeA(ax, sp);
    reg.sp = U32_ADD(reg.sp, disp);

    prefetch<C>();

    //           00  10  20        00  10  20        00  10  20
    //           .b  .b  .b        .w  .w  .w        .l  .l  .l
    CYCLES_IP   ( 0,  0,  0,       16, 16,  5,        0,  0,  6);

    FINALIZE
}